

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  ImGuiContext *pIVar1;
  long lVar2;
  int n;
  long lVar3;
  
  pIVar1 = GImGui;
  (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  ImVector<ImGuiTableColumnSortSpecs>::clear(&table->SortSpecsMulti);
  table->IsSortSpecsDirty = true;
  ImVector<char>::clear(&(table->ColumnsNames).Buf);
  table->MemoryCompacted = true;
  lVar2 = 0x50;
  for (lVar3 = 0; lVar3 < table->ColumnsCount; lVar3 = lVar3 + 1) {
    *(undefined2 *)((long)&((table->Columns).Data)->Flags + lVar2) = 0xffff;
    lVar2 = lVar2 + 0x68;
  }
  (pIVar1->TablesLastTimeActive).Data
  [(int)(((long)table - (long)(pIVar1->Tables).Buf.Data) / 0x218)] = -1.0;
  return;
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_PRINT("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->SortSpecs.Specs = NULL;
    table->SortSpecsMulti.clear();
    table->IsSortSpecsDirty = true; // FIXME: shouldn't have to leak into user performing a sort
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}